

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

Layer * ncnn::create_layer(char *type)

{
  int iVar1;
  Layer *pLVar2;
  int i;
  ulong uVar3;
  undefined **ppuVar4;
  
  ppuVar4 = &layer_registry;
  uVar3 = 0;
  do {
    iVar1 = strcmp(type,*ppuVar4);
    if (iVar1 == 0) goto LAB_00116c5c;
    uVar3 = uVar3 + 1;
    ppuVar4 = ppuVar4 + 2;
  } while (uVar3 != 0x4b);
  uVar3 = 0xffffffff;
LAB_00116c5c:
  if (((uint)uVar3 < 0x4b) &&
     ((code *)(&PTR_AbsVal_final_layer_creator_001866e8)[(uVar3 & 0xffffffff) * 2] != (code *)0x0))
  {
    pLVar2 = (Layer *)(*(code *)(&PTR_AbsVal_final_layer_creator_001866e8)[(uVar3 & 0xffffffff) * 2]
                      )();
    pLVar2->typeindex = (uint)uVar3;
  }
  else {
    pLVar2 = (Layer *)0x0;
  }
  return pLVar2;
}

Assistant:

Layer* create_layer(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer(index);
}